

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShell::print(UtestShell *this,char *text,char *fileName,size_t lineNumber)

{
  TestResult *pTVar1;
  char *pcVar2;
  SimpleString local_58 [2];
  undefined1 local_38 [8];
  SimpleString stringToPrint;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  UtestShell *this_local;
  
  stringToPrint.bufferSize_ = lineNumber;
  SimpleString::SimpleString((SimpleString *)local_38,"\n");
  SimpleString::operator+=((SimpleString *)local_38,fileName);
  SimpleString::operator+=((SimpleString *)local_38,":");
  ::StringFrom((unsigned_long)local_58);
  SimpleString::operator+=((SimpleString *)local_38,local_58);
  SimpleString::~SimpleString(local_58);
  SimpleString::operator+=((SimpleString *)local_38," ");
  SimpleString::operator+=((SimpleString *)local_38,text);
  pTVar1 = getTestResult(this);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_38);
  (*pTVar1->_vptr_TestResult[0xe])(pTVar1,pcVar2);
  SimpleString::~SimpleString((SimpleString *)local_38);
  return;
}

Assistant:

void UtestShell::print(const char *text, const char* fileName, size_t lineNumber)
{
    SimpleString stringToPrint = "\n";
    stringToPrint += fileName;
    stringToPrint += ":";
    stringToPrint += StringFrom(lineNumber);
    stringToPrint += " ";
    stringToPrint += text;
    getTestResult()->print(stringToPrint.asCharString());
}